

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O2

ContinuousBounds *
compute_bounds(ContinuousBounds *__return_storage_ptr__,
              vector<PointT,_std::allocator<PointT>_> *points)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float *pfVar5;
  pointer pPVar6;
  pointer pPVar7;
  vector<PointT,_std::allocator<PointT>_> *__range1;
  
  diy::Bounds<float>::Bounds(__return_storage_ptr__,3);
  pPVar7 = (points->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (__return_storage_ptr__->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>
           .m_begin;
  *pfVar4 = pPVar7->coords[0];
  pfVar4[1] = pPVar7->coords[1];
  pfVar4[2] = pPVar7->coords[2];
  pfVar5 = (__return_storage_ptr__->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>
           .m_begin;
  *pfVar5 = pPVar7->coords[0];
  pfVar5[1] = pPVar7->coords[1];
  pfVar5[2] = pPVar7->coords[2];
  pPVar6 = (points->super__Vector_base<PointT,_std::allocator<PointT>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (; pPVar7 != pPVar6; pPVar7 = pPVar7 + 1) {
    fVar1 = pPVar7->coords[0];
    fVar2 = pPVar7->coords[1];
    fVar3 = pPVar7->coords[2];
    if (fVar1 < *pfVar4) {
      *pfVar4 = fVar1;
    }
    if (fVar2 < pfVar4[1]) {
      pfVar4[1] = fVar2;
    }
    if (fVar3 < pfVar4[2]) {
      pfVar4[2] = fVar3;
    }
    if (*pfVar5 <= fVar1 && fVar1 != *pfVar5) {
      *pfVar5 = fVar1;
    }
    if (pfVar5[1] <= fVar2 && fVar2 != pfVar5[1]) {
      pfVar5[1] = fVar2;
    }
    if (pfVar5[2] <= fVar3 && fVar3 != pfVar5[2]) {
      pfVar5[2] = fVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

diy::ContinuousBounds compute_bounds(std::vector<PointT> points)
{
  diy::ContinuousBounds bds(3);
  bds.min[kd_x] = points[0][kd_x];
  bds.min[kd_y] = points[0][kd_y];
  bds.min[kd_z] = points[0][kd_z];
  bds.max[kd_x] = points[0][kd_x];
  bds.max[kd_y] = points[0][kd_y];
  bds.max[kd_z] = points[0][kd_z];
  // just need to find min and max of each coordinate axis
  for (const auto pt : points)
  {
    if (pt[kd_x] < bds.min[kd_x])
      bds.min[kd_x] = pt[kd_x];
    if (pt[kd_y] < bds.min[kd_y])
      bds.min[kd_y] = pt[kd_y];
    if (pt[kd_z] < bds.min[kd_z])
      bds.min[kd_z] = pt[kd_z];

    if (pt[kd_x] > bds.max[kd_x])
      bds.max[kd_x] = pt[kd_x];
    if (pt[kd_y] > bds.max[kd_y])
      bds.max[kd_y] = pt[kd_y];
    if (pt[kd_z] > bds.max[kd_z])
      bds.max[kd_z] = pt[kd_z];
  }

  return bds;
}